

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid2d_refinement_pattern_tests.cc
# Opt level: O3

void __thiscall
lf::refinement::test::TopRefTest_TopSegRef_Test::~TopRefTest_TopSegRef_Test
          (TopRefTest_TopSegRef_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TopRefTest, TopSegRef) {
  // Set up refinement pattern
  Hybrid2DRefinementPattern rp_copy(lf::base::RefEl::kSegment(),
                                    RefPat::rp_copy);
  Hybrid2DRefinementPattern rp_split(lf::base::RefEl::kSegment(),
                                     RefPat::rp_split);

  std::cout << "COPY(N=" << rp_copy.LatticeConst()
            << "): " << rp_copy.ChildPolygons(0) << std::endl;
  std::cout << "SPLIT(N=" << rp_copy.LatticeConst()
            << "): " << rp_split.ChildPolygons(0) << std::endl;
}